

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O2

void __thiscall amrex::BoxArray::removeOverlap(BoxArray *this,bool simplify)

{
  int iVar1;
  element_type *peVar2;
  element_type *peVar3;
  long lVar4;
  ulong uVar5;
  pointer pBVar6;
  bool bVar7;
  IndexType IVar8;
  mapped_type *this_00;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  Box *b_1;
  Box *b;
  Box *pBVar15;
  pointer __x;
  IntVect IVar16;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  BoxList bl;
  BoxList bl_diff;
  BoxArray nba;
  
  IVar8 = BATransformer::index_type(&this->m_bat);
  if (IVar8.itype != 0) {
    Abort_host("BoxArray::removeOverlap() supports cell-centered only");
  }
  IVar16 = BATransformer::coarsen_ratio(&this->m_bat);
  if (IVar16.vect[2] != 1 || IVar16.vect._0_8_ != 0x100000001) {
    Abort_host("BoxArray::removeOverlap() must have m_crse_ratio == 1");
  }
  uniqify(this);
  peVar2 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  isects.
  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  isects.
  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  isects.
  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  BoxList::BoxList(&bl_diff);
  for (uVar14 = 0;
      peVar3 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
      lVar4 = *(long *)&(peVar3->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                        super__Vector_impl_data,
      (long)uVar14 <
      ((long)*(pointer *)
              ((long)&(peVar3->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                      super__Vector_impl_data + 8) - lVar4) / 0x1c; uVar14 = uVar14 + 1) {
    bVar7 = Box::ok((Box *)(lVar4 + uVar14 * 0x1c));
    if (bVar7) {
      intersections(this,(Box *)(uVar14 * 0x1c +
                                *(long *)&(((this->m_ref).
                                            super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr)->m_abox).
                                          super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                          ._M_impl.super__Vector_impl_data),&isects);
      uVar9 = (ulong)((long)isects.
                            super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)isects.
                           super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 5;
      uVar10 = uVar9 & 0xffffffff;
      if ((int)uVar9 < 1) {
        uVar10 = 0;
      }
      for (uVar9 = 0; uVar9 != uVar10; uVar9 = uVar9 + 1) {
        if (uVar14 != (uint)isects.
                            super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar9].first) {
          pBVar15 = (Box *)((long)isects.
                                  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar9].first * 0x1c +
                           *(long *)&(((this->m_ref).
                                       super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_ptr)->m_abox).
                                     super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                     _M_impl.super__Vector_impl_data);
          boxDiff(&bl_diff,pBVar15,
                  &isects.
                   super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar9].second);
          pBVar6 = bl_diff.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          (pBVar15->smallend).vect[0] = 1;
          (pBVar15->smallend).vect[1] = 1;
          (pBVar15->smallend).vect[2] = 1;
          (pBVar15->bigend).vect[0] = 0;
          (pBVar15->bigend).vect[1] = 0;
          *(undefined8 *)((pBVar15->bigend).vect + 2) = 0;
          for (__x = bl_diff.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                     super__Vector_impl_data._M_start; __x != pBVar6; __x = __x + 1) {
            std::vector<amrex::Box,_std::allocator<amrex::Box>_>::push_back
                      ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                       (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,__x);
            peVar3 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            uVar5 = *(ulong *)(__x->smallend).vect;
            nba.m_bat.m_op.m_bndryReg.m_typ.itype = (IndexType)(__x->smallend).vect[2];
            iVar1 = (peVar3->crsn).vect[0];
            uVar11 = (uint)uVar5;
            if (iVar1 != 1) {
              if (iVar1 == 4) {
                if ((int)uVar11 < 0) {
                  uVar11 = (int)uVar11 >> 2;
                }
                else {
                  uVar11 = uVar11 >> 2;
                }
              }
              else if (iVar1 == 2) {
                if ((int)uVar11 < 0) {
                  uVar11 = (int)uVar11 >> 1;
                }
                else {
                  uVar11 = uVar11 >> 1;
                }
              }
              else if ((int)uVar11 < 0) {
                uVar11 = ~((int)~uVar11 / iVar1);
              }
              else {
                uVar11 = (uint)((long)((ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 |
                                      uVar5 & 0xffffffff) / (long)iVar1);
              }
            }
            uVar13 = uVar5 >> 0x20;
            iVar1 = (peVar3->crsn).vect[1];
            if (iVar1 != 1) {
              uVar12 = (uint)(uVar5 >> 0x20);
              if (iVar1 == 4) {
                if ((long)uVar5 < 0) {
                  uVar13 = (ulong)(uint)((int)uVar12 >> 2);
                }
                else {
                  uVar13 = (ulong)(uVar12 >> 2);
                }
              }
              else if (iVar1 == 2) {
                if ((long)uVar5 < 0) {
                  uVar13 = (ulong)(uint)((int)uVar12 >> 1);
                }
                else {
                  uVar13 = (ulong)(uVar12 >> 1);
                }
              }
              else if ((long)uVar5 < 0) {
                uVar13 = (ulong)(uint)~((int)~uVar12 / iVar1);
              }
              else {
                uVar13 = (long)((ulong)(uint)((int)uVar12 >> 0x1f) << 0x20 | uVar13) / (long)iVar1 &
                         0xffffffff;
              }
            }
            iVar1 = (peVar3->crsn).vect[2];
            if (iVar1 != 1) {
              if (iVar1 == 4) {
                if ((int)nba.m_bat.m_op.m_bndryReg.m_typ.itype < 0) {
                  nba.m_bat.m_op.m_bndryReg.m_typ.itype =
                       (IndexType)((int)nba.m_bat.m_op.m_bndryReg.m_typ.itype >> 2);
                }
                else {
                  nba.m_bat.m_op.m_bndryReg.m_typ.itype =
                       (IndexType)((uint)nba.m_bat.m_op.m_bndryReg.m_typ.itype >> 2);
                }
              }
              else if (iVar1 == 2) {
                if ((int)nba.m_bat.m_op.m_bndryReg.m_typ.itype < 0) {
                  nba.m_bat.m_op.m_bndryReg.m_typ.itype =
                       (IndexType)((int)nba.m_bat.m_op.m_bndryReg.m_typ.itype >> 1);
                }
                else {
                  nba.m_bat.m_op.m_bndryReg.m_typ.itype =
                       (IndexType)((uint)nba.m_bat.m_op.m_bndryReg.m_typ.itype >> 1);
                }
              }
              else if ((int)nba.m_bat.m_op.m_bndryReg.m_typ.itype < 0) {
                nba.m_bat.m_op.m_bndryReg.m_typ.itype =
                     (IndexType)~((int)~(uint)nba.m_bat.m_op.m_bndryReg.m_typ.itype / iVar1);
              }
              else {
                nba.m_bat.m_op.m_bndryReg.m_typ.itype =
                     (IndexType)((int)nba.m_bat.m_op.m_bndryReg.m_typ.itype / iVar1);
              }
            }
            nba.m_bat._0_8_ = (ulong)uVar11 | uVar13 << 0x20;
            this_00 = std::__detail::
                      _Map_base<amrex::IntVect,_std::pair<const_amrex::IntVect,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_amrex::IntVect,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<amrex::IntVect>,_amrex::IntVect::shift_hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<amrex::IntVect,_std::pair<const_amrex::IntVect,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_amrex::IntVect,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<amrex::IntVect>,_amrex::IntVect::shift_hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&peVar2->hash,(key_type *)&nba);
            peVar3 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            bl.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
            super__Vector_impl_data._M_start._0_4_ =
                 (int)(((long)*(pointer *)
                               ((long)&(peVar3->m_abox).
                                       super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                       super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                       _M_impl.super__Vector_impl_data + 8) -
                       *(long *)&(peVar3->m_abox).
                                 super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl
                                 .super__Vector_impl_data) / 0x1c) + -1;
            std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,(int *)&bl);
          }
        }
      }
    }
  }
  IVar8 = BATransformer::index_type(&this->m_bat);
  BoxList::BoxList(&bl,IVar8);
  peVar2 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pBVar6 = *(pointer *)
            ((long)&(peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data + 8);
  for (pBVar15 = (peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_start; pBVar15 != pBVar6; pBVar15 = pBVar15 + 1) {
    bVar7 = Box::ok(pBVar15);
    if (bVar7) {
      std::vector<amrex::Box,_std::allocator<amrex::Box>_>::push_back
                ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)&bl,pBVar15);
    }
  }
  if (simplify) {
    BoxList::simplify(&bl,false);
  }
  BoxArray(&nba,&bl);
  operator=(this,&nba);
  ~BoxArray(&nba);
  std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base
            ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)&bl);
  std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base
            ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)&bl_diff);
  std::_Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::
  ~_Vector_base(&isects.
                 super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
               );
  return;
}

Assistant:

void
BoxArray::removeOverlap (bool simplify)
{
    if (! ixType().cellCentered()) {
        amrex::Abort("BoxArray::removeOverlap() supports cell-centered only");
    }

    if (crseRatio() != IntVect::TheUnitVector()) {
        amrex::Abort("BoxArray::removeOverlap() must have m_crse_ratio == 1");
    }

    uniqify();

    BARef::HashType& BoxHashMap = m_ref->hash;

    const Box EmptyBox;

    std::vector< std::pair<int,Box> > isects;
    //
    // Note that "size()" can increase in this loop!!!
    //
#ifdef AMREX_MEM_PROFILING
    m_ref->updateMemoryUsage_box(-1);
    m_ref->updateMemoryUsage_hash(-1);
    Long total_hash_bytes_save = m_ref->total_hash_bytes;
#endif

    BoxList bl_diff;

    for (int i = 0; i < size(); i++)
    {
        if (m_ref->m_abox[i].ok())
        {
            intersections(m_ref->m_abox[i],isects);

            for (int j = 0, N = isects.size(); j < N; j++)
            {
                if (isects[j].first == i) continue;

                Box& bx = m_ref->m_abox[isects[j].first];

                amrex::boxDiff(bl_diff, bx, isects[j].second);

                bx = EmptyBox;

                for (const Box& b : bl_diff)
                {
                    m_ref->m_abox.push_back(b);
                    BoxHashMap[amrex::coarsen(b.smallEnd(),m_ref->crsn)].push_back(size()-1);
                }
            }
        }
    }
#ifdef AMREX_MEM_PROFILING
    m_ref->updateMemoryUsage_box(1);
#endif
    //
    // We now have "holes" in our BoxArray. Make us good.
    //
    BoxList bl(ixType());
    for (const auto& b : m_ref->m_abox) {
        if (b.ok()) {
            bl.push_back(b);
        }
    }

    if (simplify) {
        bl.simplify();
    }

    BoxArray nba(std::move(bl));

    *this = nba;

#ifdef AMREX_MEM_PROFILING
    m_ref->total_hash_bytes = total_hash_bytes_save;
#endif

    BL_ASSERT(isDisjoint());
}